

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_zlib_decompress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGDecompressSettings *settings)

{
  uint uVar1;
  ucvector v;
  ucvector local_30;
  
  local_30.data = *out;
  local_30.size = *outsize;
  local_30.allocsize = local_30.size;
  uVar1 = lodepng_zlib_decompressv(&local_30,in,insize,settings);
  *out = local_30.data;
  *outsize = local_30.size;
  return uVar1;
}

Assistant:

unsigned lodepng_zlib_decompress(unsigned char** out, size_t* outsize, const unsigned char* in,
                                 size_t insize, const LodePNGDecompressSettings* settings) {
  ucvector v = ucvector_init(*out, *outsize);
  unsigned error = lodepng_zlib_decompressv(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}